

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_logic.cc
# Opt level: O0

void __thiscall
CLogicSocket::procPingTimeOutChecking(CLogicSocket *this,LPSTRUC_MSG_HEADER tmpmsg,time_t cur_time)

{
  SourceFile file;
  LogLevel LVar1;
  long in_RDX;
  long *in_RSI;
  char (*in_RDI) [101];
  lp_connection_t p_Conn;
  CMemory *p_memory;
  lp_connection_t in_stack_ffffffffffffefc8;
  CSocekt *in_stack_ffffffffffffefd0;
  SourceFile *in_stack_ffffffffffffefe0;
  Logger *in_stack_fffffffffffff000;
  
  CMemory::GetInstance();
  if (in_RSI[1] == *(long *)(*in_RSI + 0x20)) {
    if ((long)(*(int *)(in_RDI[1] + 3) * 3 + 10) < in_RDX - *(long *)(*in_RSI + 0x108)) {
      LVar1 = muduo::Logger::logLevel();
      if ((int)LVar1 < 3) {
        muduo::Logger::SourceFile::SourceFile<101>(in_stack_ffffffffffffefe0,in_RDI);
        in_stack_ffffffffffffefc8 = (lp_connection_t)&stack0xfffffffffffff000;
        file._8_8_ = in_stack_ffffffffffffefe0;
        file.data_ = *in_RDI;
        muduo::Logger::Logger
                  ((Logger *)in_stack_ffffffffffffefd0,file,
                   (int)((ulong)in_stack_ffffffffffffefc8 >> 0x20));
        in_stack_ffffffffffffefd0 =
             (CSocekt *)muduo::Logger::stream((Logger *)in_stack_ffffffffffffefc8);
        muduo::LogStream::operator<<((LogStream *)in_stack_ffffffffffffefe0,*in_RDI);
        muduo::Logger::~Logger(in_stack_fffffffffffff000);
      }
      CSocekt::zdClosesocketProc(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
    }
    CMemory::FreeMemory((CMemory *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  }
  else {
    CMemory::FreeMemory((CMemory *)in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8);
  }
  return;
}

Assistant:

void CLogicSocket::procPingTimeOutChecking(LPSTRUC_MSG_HEADER tmpmsg,time_t cur_time)
{
    CMemory *p_memory = CMemory::GetInstance();

    if(tmpmsg->iCurrsequence == tmpmsg->pConn->iCurrsequence) //此连接没断
    {
        lp_connection_t p_Conn = tmpmsg->pConn;

        //超时踢的判断标准就是 每次检查的时间间隔*3，超过这个时间没发送心跳包，就踢【大家可以根据实际情况自由设定】
        if( (cur_time - p_Conn->lastPingTime ) > (m_iWaitTime * 3 + 10) )
        {
            //踢出去【如果此时此刻该用户正好断线，则这个socket可能立即被后续上来的连接复用  如果真有人这么倒霉，赶上这个点了，那么可能错踢，错踢就错踢】            
            LOG_INFO << "时间到不发心跳包，踢出去!";   //感觉OK
            zdClosesocketProc(p_Conn); 
        }   
             
        p_memory->FreeMemory(tmpmsg);//内存要释放
    }
    else //此连接断了
    {
        p_memory->FreeMemory(tmpmsg);//内存要释放
    }
    return;
}